

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O3

void add_tractor_beam_to_ship(Am_Object *beam,Am_Object *ship)

{
  Am_Slot_Key AVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Value_List beams;
  Am_Value_List aAStack_28 [16];
  
  Am_Value_List::Am_Value_List(aAStack_28);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)ship,(ulong)TB_LIST);
  Am_Value_List::operator=(aAStack_28,pAVar2);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(beam);
  Am_Value_List::Add(aAStack_28,pAVar3,1,1);
  AVar1 = TB_LIST;
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(aAStack_28);
  Am_Object::Set((ushort)ship,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar3);
  Am_Value_List::~Am_Value_List(aAStack_28);
  return;
}

Assistant:

void
add_tractor_beam_to_ship(Am_Object beam, Am_Object ship)
{
  Am_Value_List beams;
  beams = ship.Get(TB_LIST);
  beams.Add(beam);
  ship.Set(TB_LIST, beams);
}